

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::LinearCost::setCostBias
          (LinearCost *this,double stateCostBias,double controlCostBias)

{
  TimeInvariantObject<double> *pTVar1;
  double local_28;
  double local_20;
  
  local_28 = controlCostBias;
  local_20 = stateCostBias;
  pTVar1 = (TimeInvariantObject<double> *)operator_new(0x10);
  TimeInvariantObject<double>::TimeInvariantObject(pTVar1,&local_20);
  std::__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::TimeInvariantObject<double>>
            ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,(__gnu_cxx::_Lock_policy)2>
              *)&(this->super_QuadraticLikeCost).m_timeVaryingStateCostBias,pTVar1);
  pTVar1 = (TimeInvariantObject<double> *)operator_new(0x10);
  TimeInvariantObject<double>::TimeInvariantObject(pTVar1,&local_28);
  std::__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::TimeInvariantObject<double>>
            ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,(__gnu_cxx::_Lock_policy)2>
              *)&(this->super_QuadraticLikeCost).m_timeVaryingControlCostBias,pTVar1);
  return true;
}

Assistant:

bool LinearCost::setCostBias(double stateCostBias, double controlCostBias)
        {
            m_timeVaryingStateCostBias.reset(new TimeInvariantDouble(stateCostBias));
            m_timeVaryingControlCostBias.reset(new TimeInvariantDouble(controlCostBias));
            return true;
        }